

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O0

ssize_t zstd_filter_read(archive_read_filter *self,void **p)

{
  undefined8 *puVar1;
  archive_read *paVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  bool bVar6;
  size_t ret;
  ZSTD_inBuffer in;
  ZSTD_outBuffer out;
  ssize_t avail_in;
  size_t decompressed;
  private_data_conflict2 *state;
  void **p_local;
  archive_read_filter *self_local;
  
  puVar1 = (undefined8 *)self->data;
  in.pos = puVar1[1];
  out.dst = (void *)puVar1[2];
  out.size = 0;
  do {
    bVar6 = false;
    if (out.size < out.dst) {
      bVar6 = *(char *)((long)puVar1 + 0x21) == '\0';
    }
    if (!bVar6) {
LAB_0012aac3:
      puVar1[3] = out.size + puVar1[3];
      if (out.size == 0) {
        *p = (void *)0x0;
      }
      else {
        *p = (void *)puVar1[1];
      }
      return out.size;
    }
    if (*(char *)(puVar1 + 4) == '\0') {
      uVar4 = ZSTD_initDStream(*puVar1);
      iVar3 = ZSTD_isError(uVar4);
      if (iVar3 != 0) {
        paVar2 = self->archive;
        uVar4 = ZSTD_getErrorName(uVar4);
        archive_set_error(&paVar2->archive,-1,"Error initializing zstd decompressor: %s",uVar4);
        return -0x1e;
      }
    }
    ret = (size_t)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&out.pos);
    if ((long)out.pos < 0) {
      return out.pos;
    }
    if (((void *)ret == (void *)0x0) && (out.pos == 0)) {
      if (*(char *)(puVar1 + 4) != '\0') {
        archive_set_error(&self->archive->archive,-1,"Truncated zstd input");
        return -0x1e;
      }
      *(undefined1 *)((long)puVar1 + 0x21) = 1;
      goto LAB_0012aac3;
    }
    in.src = (void *)out.pos;
    in.size = 0;
    lVar5 = ZSTD_decompressStream(*puVar1,&in.pos,&ret);
    iVar3 = ZSTD_isError(lVar5);
    if (iVar3 != 0) {
      paVar2 = self->archive;
      uVar4 = ZSTD_getErrorName(lVar5);
      archive_set_error(&paVar2->archive,-1,"Zstd decompression failed: %s",uVar4);
      return -0x1e;
    }
    __archive_read_filter_consume(self->upstream,in.size);
    *(bool *)(puVar1 + 4) = lVar5 != 0;
  } while( true );
}

Assistant:

static ssize_t
zstd_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	ZSTD_outBuffer out;
	ZSTD_inBuffer in;
	size_t ret;

	state = (struct private_data *)self->data;

	out = (ZSTD_outBuffer) { state->out_block, state->out_block_size, 0 };

	/* Try to fill the output buffer. */
	while (out.pos < out.size && !state->eof) {
		if (!state->in_frame) {
			ret = ZSTD_initDStream(state->dstream);
			if (ZSTD_isError(ret)) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Error initializing zstd decompressor: %s",
				    ZSTD_getErrorName(ret));
				return (ARCHIVE_FATAL);
			}
		}
		in.src = __archive_read_filter_ahead(self->upstream, 1,
		    &avail_in);
		if (avail_in < 0) {
			return avail_in;
		}
		if (in.src == NULL && avail_in == 0) {
			if (!state->in_frame) {
				/* end of stream */
				state->eof = 1;
				break;
			} else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Truncated zstd input");
				return (ARCHIVE_FATAL);
			}
		}
		in.size = avail_in;
		in.pos = 0;

		{
			ret = ZSTD_decompressStream(state->dstream, &out, &in);

			if (ZSTD_isError(ret)) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Zstd decompression failed: %s",
				    ZSTD_getErrorName(ret));
				return (ARCHIVE_FATAL);
			}

			/* Decompressor made some progress */
			__archive_read_filter_consume(self->upstream, in.pos);

			/* ret guaranteed to be > 0 if frame isn't done yet */
			state->in_frame = (ret != 0);
		}
	}

	decompressed = out.pos;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}